

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debugallocation.cc
# Opt level: O2

void operator_delete(void *p)

{
  tcmalloc::InvokeDeleteHook(p);
  DebugDeallocate(p,-0x145237f,0);
  return;
}

Assistant:

PERFTOOLS_DLL_DECL void tc_delete(void* p) PERFTOOLS_NOTHROW {
  tcmalloc::InvokeDeleteHook(p);
  DebugDeallocate(p, MallocBlock::kNewType, 0);
  force_frame();
}